

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_xi(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i64 val;
  _Bool _Var2;
  uint uVar3;
  TCGv_i64 pTVar4;
  
  tcg_ctx = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_i64(tcg_ctx);
  o->in1 = pTVar4;
  _Var2 = s390_has_feat(s->uc,S390_FEAT_INTERLOCKED_ACCESS_2);
  pTVar4 = o->in1;
  pTVar1 = o->addr1;
  if (_Var2) {
    val = o->in2;
    uVar3 = get_mem_index(s);
    tcg_gen_atomic_fetch_xor_i64_s390x
              (tcg_ctx,pTVar4,pTVar1,val,(ulong)uVar3,(MemOp_conflict)s->insn->data);
  }
  else {
    uVar3 = get_mem_index(s);
    tcg_gen_qemu_ld_i64_s390x(tcg_ctx,pTVar4,pTVar1,(ulong)uVar3,(MemOp_conflict)s->insn->data);
  }
  tcg_gen_xor_i64_s390x(tcg_ctx,o->out,o->in1,o->in2);
  _Var2 = s390_has_feat(s->uc,S390_FEAT_INTERLOCKED_ACCESS_2);
  if (!_Var2) {
    pTVar4 = o->out;
    pTVar1 = o->addr1;
    uVar3 = get_mem_index(s);
    tcg_gen_qemu_st_i64_s390x(tcg_ctx,pTVar4,pTVar1,(ulong)uVar3,(MemOp_conflict)s->insn->data);
  }
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_xi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = tcg_temp_new_i64(tcg_ctx);

    if (!s390_has_feat(s->uc, S390_FEAT_INTERLOCKED_ACCESS_2)) {
        tcg_gen_qemu_ld_tl(tcg_ctx, o->in1, o->addr1, get_mem_index(s), s->insn->data);
    } else {
        /* Perform the atomic operation in memory. */
        tcg_gen_atomic_fetch_xor_i64(tcg_ctx, o->in1, o->addr1, o->in2, get_mem_index(s),
                                     s->insn->data);
    }

    /* Recompute also for atomic case: needed for setting CC. */
    tcg_gen_xor_i64(tcg_ctx, o->out, o->in1, o->in2);

    if (!s390_has_feat(s->uc, S390_FEAT_INTERLOCKED_ACCESS_2)) {
        tcg_gen_qemu_st_tl(tcg_ctx, o->out, o->addr1, get_mem_index(s), s->insn->data);
    }
    return DISAS_NEXT;
}